

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O0

void __thiscall Amiga::Audio::set_modulation_flags(Audio *this,uint16_t flags)

{
  uint16_t flags_local;
  Audio *this_local;
  
  this->channels_[3].attach_period = (flags & 0x80) != 0;
  this->channels_[2].attach_period = (flags & 0x40) != 0;
  this->channels_[1].attach_period = (flags & 0x20) != 0;
  this->channels_[0].attach_period = (flags & 0x10) != 0;
  this->channels_[3].attach_volume = (flags & 8) != 0;
  this->channels_[2].attach_volume = (flags & 4) != 0;
  this->channels_[1].attach_volume = (flags & 2) != 0;
  this->channels_[0].attach_volume = (flags & 1) != 0;
  return;
}

Assistant:

void Audio::set_modulation_flags(uint16_t flags) {
	channels_[3].attach_period = flags & 0x80;
	channels_[2].attach_period = flags & 0x40;
	channels_[1].attach_period = flags & 0x20;
	channels_[0].attach_period = flags & 0x10;

	channels_[3].attach_volume = flags & 0x08;
	channels_[2].attach_volume = flags & 0x04;
	channels_[1].attach_volume = flags & 0x02;
	channels_[0].attach_volume = flags & 0x01;
}